

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webp_dec.c
# Opt level: O2

VP8StatusCode WebPParseHeaders(WebPHeaderStructure *headers)

{
  VP8StatusCode status;
  int has_animation;
  VP8StatusCode local_8;
  int local_4;
  
  local_4 = 0;
  local_8 = ParseHeadersInternal
                      (headers->data,headers->data_size,(int *)0x0,(int *)0x0,(int *)0x0,&local_4,
                       (int *)0x0,headers);
  if (((local_8 == VP8_STATUS_OK) || (local_8 == VP8_STATUS_NOT_ENOUGH_DATA)) && (local_4 != 0)) {
    local_8 = VP8_STATUS_UNSUPPORTED_FEATURE;
  }
  return local_8;
}

Assistant:

VP8StatusCode WebPParseHeaders(WebPHeaderStructure* const headers) {
  // status is marked volatile as a workaround for a clang-3.8 (aarch64) bug
  volatile VP8StatusCode status;
  int has_animation = 0;
  assert(headers != NULL);
  // fill out headers, ignore width/height/has_alpha.
  status = ParseHeadersInternal(headers->data, headers->data_size,
                                NULL, NULL, NULL, &has_animation,
                                NULL, headers);
  if (status == VP8_STATUS_OK || status == VP8_STATUS_NOT_ENOUGH_DATA) {
    // The WebPDemux API + libwebp can be used to decode individual
    // uncomposited frames or the WebPAnimDecoder can be used to fully
    // reconstruct them (see webp/demux.h).
    if (has_animation) {
      status = VP8_STATUS_UNSUPPORTED_FEATURE;
    }
  }
  return status;
}